

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

QWidget * iWantTheFocus(QWidget *ancestor)

{
  bool bVar1;
  FocusPolicy FVar2;
  QWidget *this;
  QWidget *in_RDI;
  int i;
  QWidget *candidate;
  int MaxIterations;
  int local_24;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar3;
  
  uVar3 = 100;
  local_24 = 0;
  this = in_RDI;
  while( true ) {
    if ((99 < local_24) || (this = QWidget::nextInFocusChain(this), this == (QWidget *)0x0)) {
      return (QWidget *)0x0;
    }
    FVar2 = QWidget::focusPolicy(this);
    if (((FVar2 & TabFocus) != NoFocus) &&
       ((this != in_RDI &&
        (bVar1 = QWidget::isAncestorOf((QWidget *)CONCAT44(uVar3,in_stack_ffffffffffffffe8),this),
        bVar1)))) break;
    local_24 = local_24 + 1;
  }
  return this;
}

Assistant:

static QWidget *iWantTheFocus(QWidget *ancestor)
{
    const int MaxIterations = 100;

    QWidget *candidate = ancestor;
    for (int i = 0; i < MaxIterations; ++i) {
        candidate = candidate->nextInFocusChain();
        if (!candidate)
            break;

        if (candidate->focusPolicy() & Qt::TabFocus) {
            if (candidate != ancestor && ancestor->isAncestorOf(candidate))
                return candidate;
        }
    }
    return nullptr;
}